

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_lagout(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  char *in_RSI;
  CHAR_DATA *victim;
  char arg [4608];
  char *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char local_1218;
  int in_stack_ffffffffffffedec;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  
  one_argument(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
  if (((local_1218 != '\0') && (*in_RSI != '\0')) &&
     (pCVar1 = get_char_world((CHAR_DATA *)arg._4568_8_,(char *)arg._4560_8_),
     pCVar1 != (CHAR_DATA *)0x0)) {
    WAIT_STATE(in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
  }
  return;
}

Assistant:

void do_lagout(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);
	if (arg[0] == '\0' || argument[0] == '\0')
	{
		return;
	}

	victim = get_char_world(ch, arg);
	if (victim == nullptr)
		return;

	WAIT_STATE(victim, 24);
}